

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O3

time_t ngx_next_time(time_t when)

{
  time_t s;
  uint uVar1;
  time_t tVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  undefined1 local_58 [8];
  tm tm;
  
  s = ngx_cached_time->sec;
  ngx_libc_localtime(s,(tm *)local_58);
  tm.tm_sec = (int)(SUB168(SEXT816(when) * SEXT816(0x48d159e26af37c05),8) >> 10) -
              (SUB164(SEXT816(when) * SEXT816(0x48d159e26af37c05),0xc) >> 0x1f);
  iVar5 = (int)when + tm.tm_sec * -0xe10;
  sVar4 = (short)iVar5;
  uVar1 = ((uint)(sVar4 * -0x7777) >> 0x10) + iVar5;
  sVar3 = ((short)uVar1 >> 5) + (short)((uVar1 & 0xffff) >> 0xf);
  local_58._4_4_ = SEXT24(sVar3);
  local_58._0_4_ = SEXT24((short)(sVar4 + sVar3 * -0x3c));
  tVar2 = mktime((tm *)local_58);
  if (tVar2 == -1) {
    tVar2 = -1;
  }
  else if (tVar2 <= s) {
    tm.tm_min = tm.tm_min + 1;
    tVar2 = mktime((tm *)local_58);
  }
  return tVar2;
}

Assistant:

time_t
ngx_next_time(time_t when)
{
    time_t     now, next;
    struct tm  tm;

    now = ngx_time();

    ngx_libc_localtime(now, &tm);

    tm.tm_hour = (int) (when / 3600);
    when %= 3600;
    tm.tm_min = (int) (when / 60);
    tm.tm_sec = (int) (when % 60);

    next = mktime(&tm);

    if (next == -1) {
        return -1;
    }

    if (next - now > 0) {
        return next;
    }

    tm.tm_mday++;

    /* mktime() should normalize a date (Jan 32, etc) */

    next = mktime(&tm);

    if (next != -1) {
        return next;
    }

    return -1;
}